

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_THash,_TEq,_phmap::priv::Alloc<long>_>::
resize(raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_THash,_TEq,_phmap::priv::Alloc<long>_>
       *this,size_t new_capacity)

{
  size_t hashval;
  ctrl_t *p;
  slot_type *psVar1;
  size_t capacity;
  undefined1 auVar2 [16];
  char *p_00;
  CopyConst<char,_ElementType<0UL>_> *pCVar3;
  CopyConst<char,_ElementType<1UL>_> *pCVar4;
  size_t i;
  size_t sVar5;
  FindInfo FVar6;
  Layout LVar7;
  LayoutType<sizeof___(Ts),_signed_char,_long> local_40;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    p = this->ctrl_;
    psVar1 = this->slots_;
    capacity = this->capacity_;
    local_40.size_ = (size_t  [2])MakeLayout(new_capacity);
    p_00 = (char *)Allocate<8ul,phmap::priv::Alloc<long>>
                             ((Alloc<long> *)&this->settings_,
                              (local_40.size_[0] + 7 & 0xfffffffffffffff8) + local_40.size_[1] * 8);
    pCVar3 = internal_layout::
             LayoutImpl<std::tuple<signed_char,long>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
             ::Pointer<0ul,char>((LayoutImpl<std::tuple<signed_char,long>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)&local_40,p_00);
    this->ctrl_ = pCVar3;
    pCVar4 = internal_layout::
             LayoutImpl<std::tuple<signed_char,long>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
             ::Pointer<1ul,char>((LayoutImpl<std::tuple<signed_char,long>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)&local_40,p_00);
    this->slots_ = pCVar4;
    memset(this->ctrl_,0x80,new_capacity + 0x10);
    this->ctrl_[new_capacity] = -1;
    reset_growth_left(this,new_capacity);
    this->capacity_ = new_capacity;
    for (sVar5 = 0; capacity != sVar5; sVar5 = sVar5 + 1) {
      if (-1 < p[sVar5]) {
        auVar2._8_8_ = 0;
        auVar2._0_8_ = psVar1[sVar5];
        hashval = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,8) +
                  SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,0);
        FVar6 = find_first_non_full(this,hashval);
        set_ctrl(this,FVar6.offset,(byte)hashval & 0x7f);
        this->slots_[FVar6.offset] = psVar1[sVar5];
      }
    }
    if (capacity != 0) {
      LVar7 = MakeLayout(capacity);
      Deallocate<8ul,phmap::priv::Alloc<long>>
                ((Alloc<long> *)&this->settings_,p,
                 (LVar7.super_LayoutType<sizeof___(Ts),_signed_char,_long>.size_[0] + 7 &
                 0xfffffffffffffff8) +
                 LVar7.super_LayoutType<sizeof___(Ts),_signed_char,_long>.size_[1] * 8);
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x807,
                "void phmap::priv::raw_hash_set<phmap::priv::(anonymous namespace)::IntPolicy, THash, TEq, phmap::priv::Alloc<long>>::resize(size_t) [Policy = phmap::priv::(anonymous namespace)::IntPolicy, Hash = THash, Eq = TEq, Alloc = phmap::priv::Alloc<long>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }